

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O2

string * ToBinaryPayload_abi_cxx11_(string *__return_storage_ptr__,UnknownFields *fields)

{
  variant<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group> *fields_00;
  byte *pbVar1;
  byte bVar2;
  pointer pUVar3;
  pointer pUVar4;
  uint32_t swapped;
  undefined4 uStack_4c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pUVar3 = (fields->super__Vector_base<UnknownField,_std::allocator<UnknownField>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pUVar4 = (fields->super__Vector_base<UnknownField,_std::allocator<UnknownField>_>)._M_impl.
                super__Vector_impl_data._M_start; pUVar4 != pUVar3; pUVar4 = pUVar4 + 1) {
    bVar2 = *(__index_type *)
             ((long)&(pUVar4->value).
                     super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
                     super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                     .
                     super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                     .super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                     .super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                     .
                     super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
             + 0x20);
    if (bVar2 < 6) {
      fields_00 = &pUVar4->value;
      switch(bVar2) {
      case 0:
        EncodeVarint((ulong)(pUVar4->field_number << 3),__return_storage_ptr__);
        EncodeVarint(*(uint64_t *)
                      &(fields_00->
                       super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>).
                       super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       ._M_u,__return_storage_ptr__);
        break;
      case 1:
        EncodeVarint((ulong)(pUVar4->field_number << 3),__return_storage_ptr__);
        EncodeVarint(*(uint64_t *)
                      &(fields_00->
                       super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>).
                       super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       .
                       super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       ._M_u,__return_storage_ptr__);
        pbVar1 = (byte *)((__return_storage_ptr__->_M_dataplus)._M_p +
                         (__return_storage_ptr__->_M_string_length - 1));
        *pbVar1 = *pbVar1 | 0x80;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        break;
      case 2:
        EncodeVarint((ulong)(pUVar4->field_number * 8 + 2),__return_storage_ptr__);
        EncodeVarint(*(uint64_t *)
                      ((long)&(pUVar4->value).
                              super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              .
                              super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              .
                              super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              .
                              super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              .
                              super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                              .
                              super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                      + 8),__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        break;
      case 3:
        EncodeVarint((ulong)(pUVar4->field_number * 8 + 1),__return_storage_ptr__);
        _swapped = *(pointer *)
                    &(fields_00->
                     super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>).
                     super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                     .
                     super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                     .super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                     .super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                     .
                     super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                     ._M_u;
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&swapped);
        break;
      case 4:
        EncodeVarint((ulong)(pUVar4->field_number * 8 + 5),__return_storage_ptr__);
        swapped = *(undefined4 *)
                   &(fields_00->
                    super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>).
                    super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                    .
                    super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                    .super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
                    super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
                    super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                    ._M_u;
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&swapped);
        break;
      case 5:
        EncodeVarint((ulong)(pUVar4->field_number * 8 + 3),__return_storage_ptr__);
        ToBinaryPayload_abi_cxx11_((string *)&swapped,(UnknownFields *)fields_00);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&swapped);
        EncodeVarint((ulong)(pUVar4->field_number * 8 + 4),__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToBinaryPayload(const UnknownFields& fields) {
  std::string ret;

  for (const auto& field : fields) {
    if (const auto* val = std::get_if<Varint>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_Varint, &ret);
      EncodeVarint(val->val, &ret);
    } else if (const auto* val = std::get_if<LongVarint>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_Varint, &ret);
      EncodeVarint(val->val, &ret);
      ret.back() |= 0x80;
      ret.push_back(0);
    } else if (const auto* val = std::get_if<Delimited>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_Delimited, &ret);
      EncodeVarint(val->val.size(), &ret);
      ret.append(val->val);
    } else if (const auto* val = std::get_if<Fixed64>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_64Bit, &ret);
      uint64_t swapped = upb_BigEndian64(val->val);
      ret.append(reinterpret_cast<const char*>(&swapped), sizeof(swapped));
    } else if (const auto* val = std::get_if<Fixed32>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_32Bit, &ret);
      uint32_t swapped = upb_BigEndian32(val->val);
      ret.append(reinterpret_cast<const char*>(&swapped), sizeof(swapped));
    } else if (const auto* val = std::get_if<Group>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_StartGroup, &ret);
      ret.append(ToBinaryPayload(val->val));
      EncodeVarint(field.field_number << 3 | kUpb_WireType_EndGroup, &ret);
    }
  }

  return ret;
}